

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_checkbox(mu_Context *ctx,char *label,int *state)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  uint id;
  ulong uVar4;
  mu_Rect mVar5;
  mu_Rect rect;
  mu_Rect rect_00;
  mu_Rect rect_01;
  int local_4c;
  int *local_38;
  
  local_38 = state;
  iVar3 = (ctx->id_stack).idx;
  if (iVar3 < 1) {
    id = 0x811c9dc5;
  }
  else {
    id = (ctx->id_stack).items[iVar3 - 1];
  }
  lVar1 = 0;
  do {
    id = (*(byte *)((long)&local_38 + lVar1) ^ id) * 0x1000193;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 8);
  ctx->last_id = id;
  rect = mu_layout_next(ctx);
  uVar2 = rect._0_8_;
  uVar4 = rect._8_8_ & 0xffffffff00000000;
  local_4c = 0;
  mu_update_control(ctx,id,rect,0);
  if ((ctx->mouse_pressed == 1) && (ctx->focus == id)) {
    *state = (uint)(*state == 0);
    local_4c = 4;
  }
  lVar1 = uVar4 + (rect._8_8_ >> 0x20);
  iVar3 = 0xb;
  if (ctx->focus != id) {
    iVar3 = (ctx->hover == id) + 9;
  }
  mVar5._8_8_ = lVar1;
  mVar5.x = (int)uVar2;
  mVar5.y = (int)(uVar2 >> 0x20);
  (*ctx->draw_frame)(ctx,mVar5,iVar3);
  if (*state != 0) {
    rect_00._8_8_ = lVar1;
    rect_00.x = (int)uVar2;
    rect_00.y = (int)(uVar2 >> 0x20);
    mu_draw_icon(ctx,2,rect_00,ctx->style->colors[0]);
  }
  rect_01._0_8_ = (ulong)(uint)(rect.x + rect.h) | uVar2 & 0xffffffff00000000;
  uVar4 = (uint)(rect.w - rect.h) | uVar4;
  rect_01.w = (int)uVar4;
  rect_01.h = (int)(uVar4 >> 0x20);
  mu_draw_control_text(ctx,label,rect_01,0,0);
  return local_4c;
}

Assistant:

int mu_checkbox(mu_Context *ctx, const char *label, int *state) {
  int res = 0;
  mu_Id id = mu_get_id(ctx, &state, sizeof(state));
  mu_Rect r = mu_layout_next(ctx);
  mu_Rect box = mu_rect(r.x, r.y, r.h, r.h);
  mu_update_control(ctx, id, r, 0);
  /* handle click */
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->focus == id) {
    res |= MU_RES_CHANGE;
    *state = !*state;
  }
  /* draw */
  mu_draw_control_frame(ctx, id, box, MU_COLOR_BASE, 0);
  if (*state) {
    mu_draw_icon(ctx, MU_ICON_CHECK, box, ctx->style->colors[MU_COLOR_TEXT]);
  }
  r = mu_rect(r.x + box.w, r.y, r.w - box.w, r.h);
  mu_draw_control_text(ctx, label, r, MU_COLOR_TEXT, 0);
  return res;
}